

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCase::initPrograms
          (BuiltinGlFragCoordXYZCase *this,SourceCollections *dst)

{
  SourceCollections *this_00;
  ProgramSources *pPVar1;
  allocator<char> local_111;
  string local_110;
  ShaderSource local_f0;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  ShaderSource local_78;
  allocator<char> local_39;
  string local_38;
  SourceCollections *local_18;
  SourceCollections *dst_local;
  BuiltinGlFragCoordXYZCase *this_local;
  
  local_18 = dst;
  dst_local = (SourceCollections *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vert",&local_39);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "#version 310 es\nlayout(location = 0) in highp vec4 a_position;\nvoid main (void)\n{\n       gl_Position = a_position;\n}\n"
             ,&local_99);
  glu::VertexSource::VertexSource((VertexSource *)&local_78,&local_98);
  glu::ProgramSources::operator<<(pPVar1,&local_78);
  glu::VertexSource::~VertexSource((VertexSource *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"frag",&local_c1);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "#version 310 es\nlayout(set=0, binding=0) uniform Scale { highp vec3 u_scale; };\nlayout(location = 0) out highp vec4 o_color;\nvoid main (void)\n{\n       o_color = vec4(gl_FragCoord.xyz * u_scale, 1.0);\n}\n"
             ,&local_111);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_f0,&local_110);
  glu::ProgramSources::operator<<(pPVar1,&local_f0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  return;
}

Assistant:

void BuiltinGlFragCoordXYZCase::initPrograms (SourceCollections& dst) const
{
	dst.glslSources.add("vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 a_position;\n"
		"void main (void)\n"
		"{\n"
		"       gl_Position = a_position;\n"
		"}\n");

	dst.glslSources.add("frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(set=0, binding=0) uniform Scale { highp vec3 u_scale; };\n"
		"layout(location = 0) out highp vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"       o_color = vec4(gl_FragCoord.xyz * u_scale, 1.0);\n"
		"}\n");
}